

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_expr.cpp
# Opt level: O2

double nivalis::detail::eval_ast
                 (Environment *env,AST *ast,vector<double,_std::allocator<double>_> *arg_vals)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  undefined8 uVar4;
  pointer pAVar5;
  pointer pUVar6;
  double dVar7;
  type tVar8;
  uint64_t uVar9;
  common_type_t<long,_long> cVar10;
  long lVar11;
  pointer pdVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long *in_FS_OFFSET;
  bool bVar17;
  ulong uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  uint uVar21;
  uint uVar22;
  vector<double,_std::allocator<double>_> f_args;
  value_type_conflict2 local_80;
  vector<double,_std::allocator<double>_> *local_78;
  allocator_type local_69;
  ulong local_68;
  long local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  if ((char)in_FS_OFFSET[-10] == '\0') {
    in_FS_OFFSET[-0xb] = 0;
    in_FS_OFFSET[-0xd] = 0;
    in_FS_OFFSET[-0xc] = 0;
    __cxa_thread_atexit(std::vector<double,_std::allocator<double>_>::~vector,*in_FS_OFFSET + -0x68,
                        &__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -10) = 1;
  }
  if ((char)in_FS_OFFSET[-6] == '\0') {
    in_FS_OFFSET[-7] = 0;
    in_FS_OFFSET[-9] = 0;
    in_FS_OFFSET[-8] = 0;
    __cxa_thread_atexit(std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector,
                        *in_FS_OFFSET + -0x48,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -6) = 1;
  }
  if ((char)in_FS_OFFSET[-2] == '\0') {
    in_FS_OFFSET[-3] = 0;
    in_FS_OFFSET[-5] = 0;
    in_FS_OFFSET[-4] = 0;
    __cxa_thread_atexit(std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector,
                        *in_FS_OFFSET + -0x28,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -2) = 1;
  }
  local_60 = in_FS_OFFSET[-0x16];
  lVar14 = *in_FS_OFFSET;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)(lVar14 + -0x68),
             local_60 +
             ((long)(ast->
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(ast->
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) + 1);
  local_80 = (long)(ast->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(ast->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4;
  local_50 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(lVar14 + -0x28);
  local_58 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(lVar14 + -0x48);
  local_68 = 0;
LAB_00113936:
  bVar17 = local_80 == 0;
  local_80 = local_80 - 1;
  if (bVar17) {
    lVar14 = in_FS_OFFSET[-0x16];
    in_FS_OFFSET[-0x16] = lVar14 + -1;
    uVar4 = *(undefined8 *)(in_FS_OFFSET[-0xd] + lVar14 * 8);
    uVar19 = (undefined4)uVar4;
    uVar20 = (undefined4)((ulong)uVar4 >> 0x20);
LAB_001148f7:
    return (double)CONCAT44(uVar20,uVar19);
  }
  pAVar5 = (ast->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar22 = pAVar5[local_80].opcode;
  switch(uVar22) {
  case 0x8000:
    lVar14 = in_FS_OFFSET[-0x16];
    lVar11 = in_FS_OFFSET[-0xd];
    uVar4 = *(undefined8 *)(lVar11 + lVar14 * 8);
    uVar22 = (uint)((ulong)uVar4 >> 0x20) ^ 0x80000000;
    uVar19 = (undefined4)uVar4;
    goto LAB_00114124;
  case 0x8001:
    lVar14 = in_FS_OFFSET[-0x16];
    lVar11 = in_FS_OFFSET[-0xd];
    uVar22 = (uint)(-(ulong)(*(double *)(lVar11 + lVar14 * 8) == 0.0) >> 0x20) & 0x3ff00000;
    uVar19 = 0;
    goto LAB_00114124;
  case 0x8002:
    lVar14 = in_FS_OFFSET[-0x16];
    lVar11 = in_FS_OFFSET[-0xd];
    uVar18 = *(ulong *)(lVar11 + lVar14 * 8) & 0x7fffffffffffffff;
    uVar19 = (undefined4)uVar18;
    uVar22 = (uint)(uVar18 >> 0x20);
LAB_00114124:
    *(ulong *)(lVar11 + lVar14 * 8) = CONCAT44(uVar22,uVar19);
    goto switchD_00113ac2_caseD_55;
  case 0x8003:
    dVar7 = *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
      uVar19 = SUB84(dVar7,0);
      uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
      break;
    }
    dVar7 = SQRT(dVar7);
    goto LAB_00114838;
  case 0x8004:
    lVar14 = in_FS_OFFSET[-0x16];
    lVar11 = in_FS_OFFSET[-0xd];
    dVar7 = *(double *)(lVar11 + lVar14 * 8);
    dVar7 = dVar7 * dVar7;
    goto LAB_0011484a;
  case 0x8005:
    dVar7 = *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
    uVar18 = -(ulong)(0.0 < dVar7);
    *(ulong *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8) =
         uVar18 & 0x3ff0000000000000 |
         (ulong)(~(uint)(uVar18 >> 0x20) & (uint)(-(ulong)(dVar7 != 0.0) >> 0x20) & 0xbff00000) <<
         0x20;
    goto switchD_00113ac2_caseD_55;
  case 0x8006:
    lVar14 = in_FS_OFFSET[-0x16];
    lVar11 = in_FS_OFFSET[-0xd];
    dVar7 = floor(*(double *)(lVar11 + lVar14 * 8));
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    goto LAB_001142f6;
  case 0x8007:
    lVar14 = in_FS_OFFSET[-0x16];
    lVar11 = in_FS_OFFSET[-0xd];
    dVar7 = ceil(*(double *)(lVar11 + lVar14 * 8));
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    goto LAB_001142f6;
  case 0x8008:
    lVar14 = in_FS_OFFSET[-0x16];
    lVar11 = in_FS_OFFSET[-0xd];
    dVar7 = round(*(double *)(lVar11 + lVar14 * 8));
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
LAB_001142f6:
    *(ulong *)(lVar11 + lVar14 * 8) = CONCAT44(uVar20,uVar19);
    goto switchD_00113ac2_caseD_55;
  case 0x8009:
    dVar7 = exp(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    break;
  case 0x800a:
    dVar7 = exp2(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    break;
  case 0x800b:
    dVar7 = *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
LAB_00114169:
    dVar7 = log(dVar7);
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    break;
  case 0x800c:
    dVar7 = log10(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    break;
  case 0x800d:
    dVar7 = log2(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    break;
  case 0x800e:
    uVar19 = 0;
    uVar20 = 0;
    dVar7 = *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
    if (0.0 <= dVar7) {
      uVar19 = SUB84(dVar7,0);
      uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    }
    dVar7 = boost::math::factorial<double>((uint)(long)(double)CONCAT44(uVar20,uVar19));
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    break;
  case 0x800f:
    dVar7 = sin(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    break;
  case 0x8010:
    dVar7 = cos(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    break;
  case 0x8011:
    dVar7 = tan(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    break;
  case 0x8012:
    dVar7 = asin(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    break;
  case 0x8013:
    dVar7 = acos(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    break;
  case 0x8014:
    dVar7 = atan(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    break;
  case 0x8015:
    dVar7 = sinh(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    break;
  case 0x8016:
    dVar7 = cosh(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    break;
  case 0x8017:
    dVar7 = tanh(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    break;
  case 0x8018:
    dVar7 = tgamma(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    break;
  case 0x8019:
    dVar7 = lgamma(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    break;
  case 0x801a:
    tVar8 = boost::math::digamma<double>(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
    uVar19 = SUB84(tVar8,0);
    uVar20 = (undefined4)((ulong)tVar8 >> 0x20);
    break;
  case 0x801b:
    tVar8 = boost::math::trigamma<double>(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8))
    ;
    uVar19 = SUB84(tVar8,0);
    uVar20 = (undefined4)((ulong)tVar8 >> 0x20);
    break;
  case 0x801c:
    dVar7 = erf(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
    break;
  case 0x801d:
    tVar8 = boost::math::zeta<double>(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
    uVar19 = SUB84(tVar8,0);
    uVar20 = (undefined4)((ulong)tVar8 >> 0x20);
    break;
  case 0x801e:
    dVar7 = exp(-*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
    *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8) = 1.0 / (dVar7 + 1.0);
    goto switchD_00113ac2_caseD_55;
  case 0x801f:
    dVar7 = *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
    if (dVar7 < 15.0) {
      dVar7 = exp(dVar7);
      dVar7 = dVar7 + 1.0;
      goto LAB_00114169;
    }
    goto switchD_00113ac2_caseD_55;
  case 0x8020:
    dVar7 = *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
    dVar7 = exp(dVar7 * dVar7 * -0.5);
    dVar7 = dVar7 * 0.3989422804014327;
    goto LAB_00114838;
  default:
    switch(uVar22) {
    case 0:
      lVar14 = in_FS_OFFSET[-0x16];
      in_FS_OFFSET[-0x16] = lVar14 + 1;
      *(undefined8 *)(in_FS_OFFSET[-0xd] + 8 + lVar14 * 8) = 0x7ff8000000000000;
      break;
    case 1:
      uVar19 = (undefined4)pAVar5[local_80].field_1.ref;
      uVar20 = (undefined4)(pAVar5[local_80].field_1.ref >> 0x20);
      goto LAB_00113c66;
    case 2:
      uVar9 = pAVar5[local_80].field_1.ref;
      pdVar12 = (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      goto LAB_00113baa;
    case 3:
      uVar9 = pAVar5[local_80].field_1.ref;
      pdVar12 = (arg_vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
LAB_00113baa:
      uVar19 = SUB84(pdVar12[uVar9],0);
      uVar20 = (undefined4)((ulong)pdVar12[uVar9] >> 0x20);
LAB_00113c66:
      lVar14 = in_FS_OFFSET[-0x16];
      in_FS_OFFSET[-0x16] = lVar14 + 1;
      *(ulong *)(in_FS_OFFSET[-0xd] + 8 + lVar14 * 8) = CONCAT44(uVar20,uVar19);
      break;
    case 4:
    case 5:
    case 6:
    case 7:
    case 10:
    case 0xb:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
      break;
    case 8:
      lVar14 = in_FS_OFFSET[-4] + -8;
      local_80 = *(long *)(in_FS_OFFSET[-4] + -8) + 1;
      in_FS_OFFSET[-4] = lVar14;
      local_68 = CONCAT71((int7)((ulong)lVar14 >> 8),1);
      break;
    case 9:
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(local_58,&local_80);
      local_80 = local_80 -
                 (ast->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_start[local_80].field_1.ref;
      break;
    case 0xc:
      uVar22 = pAVar5[local_80].field_1.call_info[0];
      uVar18 = (ulong)pAVar5[local_80].field_1.call_info[1];
      pUVar6 = (env->funcs).
               super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_78 = arg_vals;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_48,uVar18,&local_69);
      lVar14 = in_FS_OFFSET[-0x16];
      lVar11 = in_FS_OFFSET[-0xd];
      for (uVar15 = 0; lVar14 = lVar14 + -1, uVar18 != uVar15; uVar15 = uVar15 + 1) {
        in_FS_OFFSET[-0x16] = lVar14;
        local_48._M_impl.super__Vector_impl_data._M_start[uVar15] =
             *(double *)(lVar11 + 8 + lVar14 * 8);
      }
      lVar14 = local_60;
      if (pUVar6[uVar22].n_args == uVar18) {
        bVar17 = (ulong)in_FS_OFFSET[-1] < 0x101 &&
                 *(pointer *)
                  &pUVar6[uVar22].expr.ast.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl !=
                 (ast->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (bVar17) {
          in_FS_OFFSET[-1] = in_FS_OFFSET[-1] + 1;
          eval_ast(env,&pUVar6[uVar22].expr.ast,(vector<double,_std::allocator<double>_> *)&local_48
                  );
          in_FS_OFFSET[-1] = in_FS_OFFSET[-1] + -1;
          lVar14 = in_FS_OFFSET[-0x16] + 1;
        }
      }
      else {
        bVar17 = false;
      }
      arg_vals = local_78;
      in_FS_OFFSET[-0x16] = lVar14;
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
      if (!bVar17) {
        uVar19 = 0;
        uVar20 = 0x7ff80000;
        goto LAB_001148f7;
      }
      break;
    case 0x10:
      if ((local_68 & 1) == 0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(local_50,&local_80);
        local_80 = *(value_type_conflict2 *)
                    (in_FS_OFFSET[-8] + -8 +
                    (ulong)(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8) == 0.0) * -8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  (local_58,(in_FS_OFFSET[-8] - in_FS_OFFSET[-9] >> 3) - 2);
      }
      else {
        lVar14 = in_FS_OFFSET[-0x16];
        in_FS_OFFSET[-0x16] = lVar14 + -1;
        *(undefined8 *)(in_FS_OFFSET[-0xd] + -8 + lVar14 * 8) =
             *(undefined8 *)(in_FS_OFFSET[-0xd] + lVar14 * 8);
        local_68 = 0;
      }
      break;
    case 0x11:
    case 0x12:
      lVar14 = in_FS_OFFSET[-0x16];
      if ((local_68 & 1) == 0) {
        lVar11 = lVar14 + 1;
        in_FS_OFFSET[-0x16] = lVar11;
        lVar13 = in_FS_OFFSET[-0xd];
        puVar2 = (undefined8 *)(lVar13 + -8 + lVar14 * 8);
        uVar4 = puVar2[1];
        puVar1 = (undefined8 *)(lVar13 + lVar14 * 8);
        *puVar1 = *puVar2;
        puVar1[1] = uVar4;
        uVar21 = 0x3ff00000;
        if (uVar22 != 0x12) {
          uVar21 = 0;
        }
        *(ulong *)(lVar13 + -8 + lVar14 * 8) = (ulong)uVar21 << 0x20;
      }
      else {
        lVar11 = lVar14 + -1;
        in_FS_OFFSET[-0x16] = lVar11;
        lVar13 = in_FS_OFFSET[-0xd];
        dVar7 = *(double *)(lVar13 + -0x18 + lVar14 * 8);
        dVar3 = *(double *)(lVar13 + lVar14 * 8);
        if (uVar22 == 0x12) {
          dVar3 = dVar3 * dVar7;
        }
        else {
          dVar3 = dVar3 + dVar7;
        }
        *(double *)(lVar13 + -0x18 + lVar14 * 8) = dVar3;
        local_68 = 0;
      }
      dVar7 = *(double *)(lVar13 + lVar11 * 8);
      if (NAN(dVar7)) {
        in_FS_OFFSET[-0x16] = lVar11 + -2;
        in_FS_OFFSET[-8] = in_FS_OFFSET[-8] + -8;
      }
      else {
        lVar14 = (long)dVar7;
        lVar16 = (long)*(double *)(lVar13 + -8 + lVar11 * 8);
        (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[pAVar5[local_80].field_1.ref] = (double)lVar14;
        dVar7 = NAN;
        if (lVar14 != lVar16) {
          dVar7 = (double)(long)(lVar14 + (ulong)(lVar14 <= lVar16) * 2 + -1);
        }
        *(double *)(lVar13 + lVar11 * 8) = dVar7;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(local_50,&local_80);
        local_80 = *(value_type_conflict2 *)(in_FS_OFFSET[-8] + -8);
      }
      break;
    case 0x18:
      in_FS_OFFSET[-0x16] = in_FS_OFFSET[-0x16] + -1;
      break;
    default:
      switch(uVar22) {
      case 0x50:
        lVar11 = in_FS_OFFSET[-0x16];
        lVar13 = in_FS_OFFSET[-0xd];
        lVar14 = lVar11 + -1;
        dVar7 = *(double *)(lVar13 + -8 + lVar11 * 8);
        uVar19 = SUB84(dVar7,0);
        uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
        dVar3 = *(double *)(lVar13 + lVar11 * 8);
        if (dVar7 <= dVar3) {
          uVar19 = SUB84(dVar3,0);
          uVar20 = (undefined4)((ulong)dVar3 >> 0x20);
        }
        dVar7 = (double)CONCAT44(uVar20,uVar19);
        goto LAB_00114700;
      case 0x51:
        lVar11 = in_FS_OFFSET[-0x16];
        lVar13 = in_FS_OFFSET[-0xd];
        lVar14 = lVar11 + -1;
        dVar7 = *(double *)(lVar13 + -8 + lVar11 * 8);
        uVar19 = SUB84(dVar7,0);
        uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
        dVar3 = *(double *)(lVar13 + lVar11 * 8);
        if (dVar3 <= dVar7) {
          uVar19 = SUB84(dVar3,0);
          uVar20 = (undefined4)((ulong)dVar3 >> 0x20);
        }
        dVar7 = (double)CONCAT44(uVar20,uVar19);
        goto LAB_00114700;
      case 0x52:
        lVar14 = in_FS_OFFSET[-0x16];
        lVar11 = in_FS_OFFSET[-0xd];
        dVar7 = *(double *)(lVar11 + lVar14 * 8);
        uVar19 = 0;
        uVar22 = 0;
        if ((dVar7 != 0.0) || (NAN(dVar7))) {
LAB_00113e26:
          uVar22 = (uint)(-(ulong)(*(double *)(lVar11 + -8 + lVar14 * 8) != 0.0) >> 0x20) &
                   0x3ff00000;
          uVar19 = 0;
        }
        goto LAB_0011460d;
      case 0x53:
        lVar14 = in_FS_OFFSET[-0x16];
        lVar11 = in_FS_OFFSET[-0xd];
        dVar7 = *(double *)(lVar11 + lVar14 * 8);
        uVar19 = 0;
        uVar22 = 0x3ff00000;
        if ((dVar7 == 0.0) && (!NAN(dVar7))) goto LAB_00113e26;
LAB_0011460d:
        *(ulong *)(lVar11 + -8 + lVar14 * 8) = CONCAT44(uVar22,uVar19);
LAB_00114613:
        in_FS_OFFSET[-0x16] = lVar14 + -1;
        goto switchD_00113ac2_caseD_55;
      case 0x54:
        lVar11 = in_FS_OFFSET[-0x16];
        lVar13 = in_FS_OFFSET[-0xd];
        lVar14 = lVar11 + -1;
        dVar7 = (double)((*(double *)(lVar13 + -8 + lVar11 * 8) != 0.0) !=
                        (*(double *)(lVar13 + lVar11 * 8) != 0.0));
LAB_00114700:
        *(double *)(lVar13 + -8 + lVar11 * 8) = dVar7;
        goto LAB_00114706;
      case 0x55:
      case 0x56:
      case 0x57:
      case 0x58:
      case 0x59:
      case 0x5a:
      case 0x5b:
      case 0x5c:
      case 0x5d:
      case 0x5e:
      case 0x5f:
        goto switchD_00113ac2_caseD_55;
      case 0x60:
        lVar11 = in_FS_OFFSET[-0x16];
        lVar13 = in_FS_OFFSET[-0xd];
        uVar18 = -(ulong)(*(double *)(lVar13 + lVar11 * 8) < *(double *)(lVar13 + -8 + lVar11 * 8));
        break;
      case 0x61:
        lVar11 = in_FS_OFFSET[-0x16];
        lVar13 = in_FS_OFFSET[-0xd];
        uVar18 = -(ulong)(*(double *)(lVar13 + lVar11 * 8) <= *(double *)(lVar13 + -8 + lVar11 * 8))
        ;
        break;
      case 0x62:
        lVar11 = in_FS_OFFSET[-0x16];
        lVar13 = in_FS_OFFSET[-0xd];
        uVar18 = -(ulong)(*(double *)(lVar13 + -8 + lVar11 * 8) == *(double *)(lVar13 + lVar11 * 8))
        ;
        break;
      case 99:
        lVar11 = in_FS_OFFSET[-0x16];
        lVar13 = in_FS_OFFSET[-0xd];
        uVar18 = -(ulong)(*(double *)(lVar13 + -8 + lVar11 * 8) != *(double *)(lVar13 + lVar11 * 8))
        ;
        break;
      case 100:
        lVar11 = in_FS_OFFSET[-0x16];
        lVar13 = in_FS_OFFSET[-0xd];
        uVar18 = -(ulong)(*(double *)(lVar13 + -8 + lVar11 * 8) <= *(double *)(lVar13 + lVar11 * 8))
        ;
        break;
      case 0x65:
        lVar11 = in_FS_OFFSET[-0x16];
        lVar13 = in_FS_OFFSET[-0xd];
        uVar18 = -(ulong)(*(double *)(lVar13 + -8 + lVar11 * 8) < *(double *)(lVar13 + lVar11 * 8));
        break;
      default:
        switch(uVar22) {
        case 0x4000:
          cVar10 = std::gcd<long,long>((long)*(double *)
                                              (in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8),
                                       (long)*(double *)
                                              (in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8));
          dVar7 = (double)cVar10;
          break;
        case 0x4001:
          dVar7 = *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
          dVar3 = *(double *)(in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8);
          local_78 = (vector<double,_std::allocator<double>_> *)(dVar7 * dVar3);
          cVar10 = std::gcd<long,long>((long)dVar7,(long)dVar3);
          lVar14 = in_FS_OFFSET[-0x16];
          *(double *)(in_FS_OFFSET[-0xd] + -8 + lVar14 * 8) = (double)local_78 / (double)cVar10;
          goto LAB_001146ce;
        case 0x4002:
          dVar7 = boost::math::binomial_coefficient<double>
                            ((uint)(long)*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8),
                             (uint)(long)*(double *)
                                          (in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8));
          break;
        case 0x4003:
          dVar7 = boost::math::falling_factorial<double>
                            ((double)((long)*(double *)
                                             (in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8) &
                                     0xffffffff),
                             (uint)(long)*(double *)
                                          (in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8));
          break;
        case 0x4004:
          dVar7 = boost::math::rising_factorial<double>
                            ((double)((long)*(double *)
                                             (in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8) &
                                     0xffffffff),
                             (int)(long)*(double *)
                                         (in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8));
          break;
        case 0x4005:
          dVar7 = boost::math::
                  beta<double,double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                            ((int)*(undefined8 *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
          break;
        case 0x4006:
          dVar7 = boost::math::polygamma<double>
                            ((int)*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8),
                             *(double *)(in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8));
          break;
        default:
          if (uVar22 == 0x20) {
            lVar11 = in_FS_OFFSET[-0x16];
            lVar13 = in_FS_OFFSET[-0xd];
            lVar14 = lVar11 + -1;
            dVar7 = *(double *)(lVar13 + lVar11 * 8) + *(double *)(lVar13 + -8 + lVar11 * 8);
            goto LAB_00114700;
          }
          if (uVar22 == 0x21) {
            lVar11 = in_FS_OFFSET[-0x16];
            lVar13 = in_FS_OFFSET[-0xd];
            lVar14 = lVar11 + -1;
            dVar7 = *(double *)(lVar13 + lVar11 * 8) - *(double *)(lVar13 + -8 + lVar11 * 8);
            goto LAB_00114700;
          }
          if (uVar22 == 0x30) {
            lVar11 = in_FS_OFFSET[-0x16];
            lVar13 = in_FS_OFFSET[-0xd];
            lVar14 = lVar11 + -1;
            dVar7 = *(double *)(lVar13 + lVar11 * 8) * *(double *)(lVar13 + -8 + lVar11 * 8);
            goto LAB_00114700;
          }
          if (uVar22 == 0x31) {
            lVar11 = in_FS_OFFSET[-0x16];
            lVar13 = in_FS_OFFSET[-0xd];
            lVar14 = lVar11 + -1;
            dVar7 = *(double *)(lVar13 + lVar11 * 8) / *(double *)(lVar13 + -8 + lVar11 * 8);
            goto LAB_00114700;
          }
          if (uVar22 == 0x32) {
            dVar7 = fmod(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8),
                         *(double *)(in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8));
            uVar19 = SUB84(dVar7,0);
            uVar22 = (uint)((ulong)dVar7 >> 0x20);
LAB_001145f6:
            lVar14 = in_FS_OFFSET[-0x16];
            lVar11 = in_FS_OFFSET[-0xd];
            goto LAB_0011460d;
          }
          if (uVar22 == 0x40) {
            dVar7 = pow(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8),
                        *(double *)(in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8));
            uVar19 = SUB84(dVar7,0);
            uVar22 = (uint)((ulong)dVar7 >> 0x20);
            goto LAB_001145f6;
          }
          if (uVar22 != 0x41) goto switchD_00113ac2_caseD_55;
          local_78 = (vector<double,_std::allocator<double>_> *)
                     log(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
          dVar7 = log(*(double *)(in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8));
          lVar14 = in_FS_OFFSET[-0x16];
          *(double *)(in_FS_OFFSET[-0xd] + -8 + lVar14 * 8) = (double)local_78 / dVar7;
          goto LAB_00114613;
        }
        lVar14 = in_FS_OFFSET[-0x16];
        *(double *)(in_FS_OFFSET[-0xd] + -8 + lVar14 * 8) = dVar7;
LAB_001146ce:
        in_FS_OFFSET[-0x16] = lVar14 + -1;
        goto switchD_00113ac2_caseD_55;
      }
      lVar14 = lVar11 + -1;
      *(ulong *)(lVar13 + -8 + lVar11 * 8) = uVar18 & 0x3ff0000000000000;
LAB_00114706:
      in_FS_OFFSET[-0x16] = lVar14;
    }
    goto switchD_00113ac2_caseD_55;
  }
  dVar7 = (double)CONCAT44(uVar20,uVar19);
LAB_00114838:
  lVar14 = in_FS_OFFSET[-0x16];
  lVar11 = in_FS_OFFSET[-0xd];
LAB_0011484a:
  *(double *)(lVar11 + lVar14 * 8) = dVar7;
switchD_00113ac2_caseD_55:
  goto LAB_00113936;
}

Assistant:

double eval_ast(Environment& env, const Expr::AST& ast,
        const std::vector<double>& arg_vals) {
    // Main AST evaluation stack
    thread_local std::vector<double> stk;
    // Stack of thunks available:
    // contains positions of thunk_jmp encountered
    thread_local std::vector<size_t> thunks;
    // Thunk call stack: contains positions to return to
    // after reaching thunk_ret
    thread_local std::vector<size_t> thunks_stk;

    // Max function call stack height
    static const size_t MAX_CALL_STK_HEIGHT = 256;
    // Curr function call stack height
    thread_local size_t call_stk_height = 0;

    thread_local size_t top = -1;
    size_t init_top = top;

    // Make sure there is enough space
    stk.resize(top + ast.size() + 1);

#ifdef ENABLE_NIVALIS_BOOST_MATH
    using namespace boost;
    using namespace boost::math;
#endif
    using namespace nivalis::OpCode;

    bool _is_thunk_ret = false;

    // Shorthands for first, 2nd, 3rd arguments to operator
#define ARG3 stk[top-2]
#define ARG2 stk[top-1]
#define ARG1 stk[top]
// Return value from thunk or func call
#define RET_VAL stk[top+1]
// Quit without messing up stack
#define FAIL_AND_QUIT do {top = init_top; return NONE; } while(0)

    for (size_t cidx = ast.size() - 1; ~cidx; --cidx) {
        const auto& node = ast[cidx];
        switch(node.opcode) {
            case null: stk[++top] = NONE; break;
            case val:
                stk[++top] = node.val;  break;
            case ref:
                stk[++top] = env.vars[node.ref]; break;
            case arg:
                stk[++top] = arg_vals[node.ref]; break;
            case thunk_jmp:
                thunks.push_back(cidx);
                cidx -= ast[cidx].ref;
                break;
            case thunk_ret:
                cidx = thunks_stk.back() + 1;
                thunks_stk.pop_back();
                _is_thunk_ret = true;
                break;
            case call:
                {
                    size_t n_args = node.call_info[1];
                    auto& func = env.funcs[node.call_info[0]];
                    std::vector<double> f_args(n_args);
                    for (size_t i = 0; i < n_args; ++i) {
                        f_args[i] = stk[top--];
                    }
                    if (n_args != func.n_args ||               // Should not happen
                        &func.expr.ast[0] == &ast[0] ||        // Disallow recursion
                        call_stk_height > MAX_CALL_STK_HEIGHT) // Too many nested calls
                            FAIL_AND_QUIT;
                    ++call_stk_height;
                    eval_ast(env, func.expr.ast, f_args);
                    --call_stk_height;
                    ++top;
                }
                break;
            case bnz:
                if (_is_thunk_ret) {
                    --top; _is_thunk_ret = false;
                    ARG1 = RET_VAL;
                } else {
                    thunks_stk.push_back(cidx);
                    cidx = thunks[thunks.size() - (ARG1 == 0.) - 1];
                    thunks.resize(thunks.size() - 2);
                }
                break;

            case sums: case prods:
                {
                    if (_is_thunk_ret) {
                        --top; _is_thunk_ret = false;
                        // update arg3 (the output)
                        if (node.opcode == prods)
                            ARG3 *= RET_VAL;
                        else
                            ARG3 += RET_VAL; // arg3 is output
                    } else {
                        // Move over the arguments and use arg3
                        // as output
                        ++top; ARG1 = ARG2; ARG2 = ARG3;
                        ARG3 = node.opcode == prods ? 1. : 0.;
                    }
                    uint64_t var_id = node.ref;
                    int64_t a = static_cast<int64_t>(ARG1),
                            b = static_cast<int64_t>(ARG2);
                    int64_t step = (a <= b) ? 1 : -1;
                    if (std::isnan(ARG1)) {
                        top -= 2; thunks.pop_back();
                    } else {
                        env.vars[var_id] = static_cast<double>(a);
                        a += step;
                        if (a == b + step) ARG1 = NONE;
                        else ARG1 = static_cast<double>(a);
                        thunks_stk.push_back(cidx);
                        cidx = thunks.back();
                    }
                }
                break;

            case bsel: --top; break;
            case add: ARG2 += ARG1; --top; break;
            case sub: ARG2 = ARG1 - ARG2; --top; break;
            case mul: ARG2 *= ARG1;  --top; break;
            case divi: ARG2 = ARG1 / ARG2; --top; break;
            case mod: ARG2 = std::fmod(ARG1, ARG2); --top; break;
            case power: ARG2 = std::pow(ARG1, ARG2); --top; break;
            case logbase: ARG2 = log(ARG1) / log(ARG2); --top; break;
            case max: ARG2 = std::max(ARG1, ARG2); --top; break;
            case min: ARG2 = std::min(ARG1, ARG2); --top; break;
            case land: ARG2 = static_cast<double>(ARG1 && ARG2); --top; break;
            case lor: ARG2 = static_cast<double>(ARG1 || ARG2); --top; break;
            case lxor: ARG2 = static_cast<double>(
                               (ARG1 != 0.) ^ (ARG2 != 0.)); --top; break;
            case gcd: ARG2 = static_cast<double>(
                              std::gcd((int64_t) ARG1,
                                       (int64_t) ARG2)); --top; break;
            case lcm: ARG2 = ARG1 * ARG2 /
                      static_cast<double>(std::gcd(
                          (int64_t) ARG1, (int64_t) ARG2)); --top; break;
#ifdef ENABLE_NIVALIS_BOOST_MATH
            case choose: ARG2 = binomial_coefficient<double>(
                            (uint32_t)ARG1, (uint32_t)ARG2); --top; break;
            case fafact: ARG2 = falling_factorial<double>(
                            (uint32_t)ARG1, (uint32_t)ARG2); --top; break;
            case rifact: ARG2 = rising_factorial<double>(
                            (uint32_t)ARG1, (uint32_t)ARG2); --top; break;
            case betab: ARG2 = beta<double>(ARG1, ARG2); --top; break;
            case polygammab:
                        ARG2 = polygamma<double>((int)ARG1, ARG2); --top;
                        break;
#else
            case choose: {
                             double ad = std::round(ARG1);
                             double bd = std::round(ARG2);
                             if (ad < 0 || bd < 0) {
                                 ARG2 = std::numeric_limits<double>::quiet_NaN(); --top; break;
                             }
                             size_t a = static_cast<size_t>(ad), b = static_cast<size_t>(bd);
                             b = std::min(b, a-b);
                             ARG2 = fa_fact(a, a-b) / fa_fact(b);
                             --top; break;
                         }
            case fafact: {
                             double ad = std::round(ARG1);
                             double bd = std::round(ARG2);
                             if (ad < 0 || bd < 0) {
                                 ARG2 = std::numeric_limits<double>::quiet_NaN(); --top; break;
                             }
                             size_t a = static_cast<size_t>(ad), b = static_cast<size_t>(bd);
                             ARG2 = fa_fact(a, a-b);
                             --top; break;
                         }
            case rifact: {
                             double ad = std::round(ARG1);
                             double bd = std::round(ARG2);
                             if (ad < 0 || bd < 0) {
                                 ARG2 = std::numeric_limits<double>::quiet_NaN(); --top; break;
                             }
                             size_t a = static_cast<size_t>(ad), b = static_cast<size_t>(bd);
                             ARG2 = fa_fact(a+b-1, a-1);
                             --top; break;
                         }
            case betab: case polygammab:
                ARG1 = NONE; print_boost_warning(node.opcode); break;
#endif
            case lt: ARG2 = static_cast<double>(ARG1 < ARG2); --top; break;
            case le: ARG2 = static_cast<double>(ARG1 <= ARG2); --top; break;
            case eq: ARG2 = static_cast<double>(ARG1 == ARG2); --top; break;
            case ne: ARG2 = static_cast<double>(ARG1 != ARG2); --top; break;
            case ge: ARG2 = static_cast<double>(ARG1 >= ARG2); --top; break;
            case gt: ARG2 = static_cast<double>(ARG1 > ARG2); --top; break;

            case unaryminus: ARG1 = -ARG1; break;
            case lnot: ARG1 = static_cast<double>(!(ARG1)); break;
            case absb: ARG1 = std::fabs(ARG1); break;
            case sqrtb: ARG1 = std::sqrt(ARG1); break;
            case sqrb: ARG1 *= ARG1; break;
            case sgn: ARG1 = ARG1 > 0 ? 1 : (ARG1 == 0 ? 0 : -1); break;
            case floorb: ARG1 = floor(ARG1); break;
            case ceilb: ARG1 = ceil(ARG1); break; case roundb: ARG1 = round(ARG1); break;

            case expb:   ARG1 = exp(ARG1); break; case exp2b: ARG1 = exp2(ARG1); break;
            case logb:   ARG1 = log(ARG1); break;
            case factb:
                        {
                            unsigned n = static_cast<unsigned>(std::max(
                                        ARG1, 0.));
#ifdef ENABLE_NIVALIS_BOOST_MATH
                            ARG1 = factorial<double>(n);
#else
                            ARG1 = fa_fact(n, 1);
#endif
                        }
                        break;
            case log2b: ARG1 = log2(ARG1); break;  case log10b: ARG1 = log10(ARG1); break;
            case sinb: ARG1 = sin(ARG1); break;   case cosb:   ARG1 = cos(ARG1); break;
            case tanb: ARG1 = tan(ARG1); break;   case asinb: ARG1 = asin(ARG1); break;
            case acosb: ARG1 = acos(ARG1); break;  case atanb: ARG1 = atan(ARG1); break;
            case sinhb: ARG1 = sinh(ARG1); break;  case coshb: ARG1 = cosh(ARG1); break;
            case tanhb: ARG1 = tanh(ARG1); break;
            case tgammab: ARG1 = std::tgamma(ARG1); break;
            case lgammab: ARG1 = std::lgamma(ARG1); break;
#ifdef ENABLE_NIVALIS_BOOST_MATH
            case digammab: ARG1 = digamma<double>(ARG1); break;
            case trigammab: ARG1 = trigamma<double>(ARG1); break;
            case zetab: ARG1 = zeta<double>(ARG1); break;
#else
           // The following functions are unavailable without Boost
            case digammab: case trigammab: case zetab:
                ARG1 = NONE; print_boost_warning(node.opcode); break;
#endif
            case erfb: ARG1 = erf(ARG1); break;
            case sigmoidb: ARG1 = 1.f / (1.f + exp(-ARG1)); break;
            case softplusb: {
                                if (ARG1 < 15.f) {
                                    ARG1 = log(1.f + exp(ARG1));
                                }
                            }
                            break;
            case gausspdfb: ARG1 = 1.f / sqrt(M_PI * 2.f) * exp(-pow(ARG1, 2.f) * 0.5f); break;
        }
    }
    return stk[top--];
}